

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O3

uint16_t patch(dw_rom *rom,uint32_t address,uint32_t size,uint8_t *data)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint8_t *puVar3;
  
  puVar3 = rom->content;
  puVar1 = puVar3 + address;
  if (size != 0) {
    uVar2 = 0;
    do {
      puVar1[uVar2] = data[uVar2];
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
    puVar3 = rom->content;
    puVar1 = puVar1 + uVar2;
  }
  return (short)puVar1 - (short)puVar3;
}

Assistant:

uint16_t patch(const dw_rom *rom, uint32_t address, const uint32_t size,
                      const uint8_t *data)
{
    uint32_t i;
    uint8_t *p;

    p = &rom->content[address];

    for (i=0; i < size; i++) {
        *(p++) = data[i];
    }
    return p - rom->content;
}